

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O2

void fill_inverse_cmap(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize,int c0,int c1,int c2
                      )

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uchar **ppuVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int *piVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uchar *puVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  byte *pbVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  uchar colorlist [256];
  int mindist [256];
  byte local_5b8 [128];
  byte abStack_538 [256];
  int local_438 [258];
  
  ppuVar4 = nim->pixels;
  uVar20 = (uint)cquantize * 8;
  uVar6 = uVar20 & 0xffffffe0;
  uVar12 = c0 * 4 & 0xffffffe0;
  uVar1 = uVar12 + 2;
  uVar16 = c1 * 8 & 0xffffffe0;
  uVar2 = uVar16 + 4;
  uVar20 = uVar20 | 0x1c;
  uVar7 = uVar6 | 4;
  uVar32 = c0 * 4 | 0x1e;
  uVar33 = c1 * 8 | 0x1c;
  uVar13 = 0;
  uVar5 = oim->colorsTotal;
  if (oim->colorsTotal < 1) {
    uVar5 = 0;
  }
  iVar9 = 0x7fffffff;
  for (; uVar5 != uVar13; uVar13 = uVar13 + 1) {
    iVar26 = oim->red[uVar13];
    uVar8 = uVar20;
    if (iVar26 < (int)uVar7) {
      iVar17 = (iVar26 - uVar7) * 2;
      iVar17 = iVar17 * iVar17;
    }
    else if (iVar26 - uVar20 == 0 || iVar26 < (int)uVar20) {
      if ((int)(uVar6 + uVar20 + 4) >> 1 < iVar26) {
        uVar8 = uVar7;
      }
      iVar17 = 0;
    }
    else {
      iVar17 = (iVar26 - uVar20) * 2;
      iVar17 = iVar17 * iVar17;
      uVar8 = uVar7;
    }
    iVar18 = oim->green[uVar13];
    uVar28 = uVar32;
    if (iVar18 < (int)uVar1) {
      iVar30 = (iVar18 - uVar1) * 3;
      iVar17 = iVar17 + iVar30 * iVar30;
    }
    else if (iVar18 - uVar32 == 0 || iVar18 < (int)uVar32) {
      if ((int)(uVar12 + uVar32 + 2) >> 1 < iVar18) {
        uVar28 = uVar1;
      }
    }
    else {
      iVar30 = (iVar18 - uVar32) * 3;
      iVar17 = iVar17 + iVar30 * iVar30;
      uVar28 = uVar1;
    }
    iVar30 = oim->blue[uVar13];
    uVar23 = uVar33;
    if (iVar30 < (int)uVar2) {
      iVar17 = iVar17 + (iVar30 - uVar2) * (iVar30 - uVar2);
    }
    else {
      iVar22 = iVar30 - uVar33;
      if (iVar22 == 0 || iVar30 < (int)uVar33) {
        if ((int)(uVar16 + uVar33 + 4) >> 1 < iVar30) {
          uVar23 = uVar2;
        }
      }
      else {
        iVar17 = iVar17 + iVar22 * iVar22;
        uVar23 = uVar2;
      }
    }
    iVar22 = (iVar26 - uVar8) * 2;
    iVar26 = (iVar18 - uVar28) * 3;
    iVar26 = (iVar30 - uVar23) * (iVar30 - uVar23) + iVar26 * iVar26 + iVar22 * iVar22;
    local_438[uVar13] = iVar17;
    if (iVar26 < iVar9) {
      iVar9 = iVar26;
    }
  }
  uVar6 = 0;
  for (uVar13 = 0; uVar5 != uVar13; uVar13 = uVar13 + 1) {
    if (local_438[uVar13] <= iVar9) {
      lVar14 = (long)(int)uVar6;
      uVar6 = uVar6 + 1;
      abStack_538[lVar14] = (byte)uVar13;
    }
  }
  piVar15 = local_438;
  for (iVar9 = 0x7f; -1 < iVar9; iVar9 = iVar9 + -1) {
    *piVar15 = 0x7fffffff;
    piVar15 = piVar15 + 1;
  }
  uVar11 = 0;
  uVar13 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar13 = uVar11;
  }
  for (; uVar11 != uVar13; uVar11 = uVar11 + 1) {
    bVar3 = abStack_538[uVar11];
    iVar30 = uVar7 - oim->red[bVar3];
    iVar26 = iVar30 * 2;
    iVar18 = uVar1 - oim->green[bVar3];
    iVar9 = iVar18 * 3;
    iVar17 = uVar2 - oim->blue[bVar3];
    iVar26 = iVar17 * iVar17 + iVar9 * iVar9 + iVar26 * iVar26;
    iVar30 = iVar30 * 0x40 + 0x100;
    piVar15 = local_438;
    pbVar29 = local_5b8;
    for (iVar9 = 3; -1 < iVar9; iVar9 = iVar9 + -1) {
      iVar10 = iVar18 * 0x48 + 0x90;
      iVar22 = iVar26;
      for (iVar21 = 7; iVar25 = iVar17 * 0x10 + 0x40, iVar19 = 3, iVar31 = iVar22, -1 < iVar21;
          iVar21 = iVar21 + -1) {
        for (; -1 < iVar19; iVar19 = iVar19 + -1) {
          if (iVar31 < *piVar15) {
            *piVar15 = iVar31;
            *pbVar29 = bVar3;
          }
          iVar31 = iVar31 + iVar25;
          piVar15 = piVar15 + 1;
          pbVar29 = pbVar29 + 1;
          iVar25 = iVar25 + 0x80;
        }
        iVar22 = iVar22 + iVar10;
        iVar10 = iVar10 + 0x120;
      }
      iVar26 = iVar26 + iVar30;
      iVar30 = iVar30 + 0x200;
    }
  }
  pbVar29 = local_5b8;
  for (uVar13 = 0; uVar13 != 4; uVar13 = uVar13 + 1) {
    puVar24 = ppuVar4[uVar13 | (long)(int)((uint)cquantize & 0xfffffffc)] +
              (long)(int)(c0 & 0xfffffff8) * 0x40 + (long)(int)(c1 & 0xfffffffc) * 2;
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      for (lVar27 = 0; (int)lVar27 != 4; lVar27 = lVar27 + 1) {
        *(ushort *)(puVar24 + lVar27 * 2) = pbVar29[lVar27] + 1;
      }
      pbVar29 = pbVar29 + lVar27;
      puVar24 = puVar24 + 0x40;
    }
  }
  return;
}

Assistant:

LOCAL (void)
fill_inverse_cmap (
    gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize,
    int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
	hist3d histogram = cquantize->histogram;
	int minc0, minc1, minc2;	/* lower left corner of update box */
	int ic0, ic1, ic2;
	register JSAMPLE *cptr;	/* pointer into bestcolor[] array */
	register histptr cachep;	/* pointer into main cache array */
	/* This array lists the candidate colormap indexes. */
	JSAMPLE colorlist[MAXNUMCOLORS];
	int numcolors;		/* number of candidate colors */
	/* This array holds the actually closest colormap index for each cell. */
	JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

	/* Convert cell coordinates to update box ID */
	c0 >>= BOX_C0_LOG;
	c1 >>= BOX_C1_LOG;
	c2 >>= BOX_C2_LOG;

	/* Compute true coordinates of update box's origin corner.
	 * Actually we compute the coordinates of the center of the corner
	 * histogram cell, which are the lower bounds of the volume we care about.
	 */
	minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
	minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
	minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);

	/* Determine which colormap entries are close enough to be candidates
	 * for the nearest entry to some cell in the update box.
	 */
	numcolors =
	    find_nearby_colors (oim, nim, cquantize, minc0, minc1, minc2, colorlist);
	find_best_colors (oim, nim, cquantize, minc0, minc1, minc2, numcolors,
			  colorlist, bestcolor);

	/* Save the best color numbers (plus 1) in the main cache array */
	c0 <<= BOX_C0_LOG;		/* convert ID back to base cell indexes */
	c1 <<= BOX_C1_LOG;
	c2 <<= BOX_C2_LOG;
	cptr = bestcolor;
	for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
		for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
			cachep = &histogram[c0 + ic0][c1 + ic1][c2];
			for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
				*cachep++ = (histcell) ((*cptr++) + 1);
			}
		}
	}
}